

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O2

void __thiscall Kernel::Signature::~Signature(Signature *this)

{
  ulong uVar1;
  
  uVar1 = (ulong)((long)(this->_funs)._cursor - (long)(this->_funs)._stack) >> 3 & 0xffffffff;
  while( true ) {
    uVar1 = uVar1 - 1;
    if ((int)(uint)uVar1 < 0) break;
    Symbol::destroyFnSymbol((this->_funs)._stack[(uint)uVar1 & 0x7fffffff]);
  }
  uVar1 = (ulong)((long)(this->_preds)._cursor - (long)(this->_preds)._stack) >> 3 & 0xffffffff;
  while( true ) {
    uVar1 = uVar1 - 1;
    if ((int)(uint)uVar1 < 0) break;
    Symbol::destroyPredSymbol((this->_preds)._stack[(uint)uVar1 & 0x7fffffff]);
  }
  uVar1 = (ulong)((long)(this->_typeCons)._cursor - (long)(this->_typeCons)._stack) >> 3 &
          0xffffffff;
  while( true ) {
    uVar1 = uVar1 - 1;
    if ((int)(uint)uVar1 < 0) break;
    Symbol::destroyTypeConSymbol((this->_typeCons)._stack[(uint)uVar1 & 0x7fffffff]);
  }
  Lib::DHMap<unsigned_int,_Shell::TermAlgebra_*,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&this->_termAlgebras);
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&this->_boolDefPreds);
  Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&(this->_fnDefPreds)._map);
  Lib::
  DHMap<std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap(&this->_iSymbols);
  Lib::Stack<Lib::SmartPtr<Lib::Stack<unsigned_int>_>_>::~Stack(&this->_distinctGroupMembers);
  Lib::Stack<Kernel::Unit_*>::~Stack(&this->_distinctGroupPremises);
  Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::~Map(&this->_varNames);
  Lib::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_Lib::DefaultHash>
  ::~Map(&this->_arityCheck);
  Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::~Map(&this->_typeConNames);
  Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::~Map(&this->_predNames);
  Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::~Map(&this->_funNames);
  Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&(this->_choiceSymbols)._map);
  Lib::Stack<Kernel::Signature::Symbol_*>::~Stack(&this->_typeCons);
  Lib::Stack<Kernel::Signature::Symbol_*>::~Stack(&this->_preds);
  Lib::Stack<Kernel::Signature::Symbol_*>::~Stack(&this->_funs);
  Lib::DHMap<Kernel::Term_*,_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&this->_formulaCounts);
  Lib::Stack<Kernel::TermList>::~Stack(&this->_dividesNvalues);
  return;
}

Assistant:

Signature::~Signature ()
{
  for (int i = _funs.length()-1;i >= 0;i--) {
    _funs[i]->destroyFnSymbol();
  }
  for (int i = _preds.length()-1;i >= 0;i--) {
    _preds[i]->destroyPredSymbol();
  }
  for (int i = _typeCons.length()-1;i >= 0;i--) {
    _typeCons[i]->destroyTypeConSymbol();
  }
}